

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateAuxSlotPtrLoad(Lowerer *this,PropertySymOpnd *propertySymOpnd,Instr *instrInsert)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  DWORD offset;
  PropertySym *this_00;
  StackSym *sym;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  IndirOpnd *src;
  
  this_00 = IR::PropertySymOpnd::GetPropertySym(propertySymOpnd);
  sym = PropertySym::GetAuxSlotPtrSym(this_00);
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,28999,"(auxSlotPtrSym)","auxSlotPtrSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = instrInsert->m_func;
  pRVar4 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,func);
  offset = Js::DynamicObject::GetOffsetOfAuxSlots();
  src = IR::IndirOpnd::New(pRVar4,offset,TyInt64,func,false);
  pRVar4 = IR::RegOpnd::New(sym,TyInt64,func);
  IR::Opnd::SetIsJITOptimizedReg(&pRVar4->super_Opnd,true);
  InsertMove(&pRVar4->super_Opnd,&src->super_Opnd,instrInsert,true);
  return;
}

Assistant:

void
Lowerer::GenerateAuxSlotPtrLoad(IR::PropertySymOpnd *propertySymOpnd, IR::Instr * instrInsert)
{
    StackSym * auxSlotPtrSym = propertySymOpnd->GetAuxSlotPtrSym();
    Assert(auxSlotPtrSym);
    Func * func = instrInsert->m_func;

    IR::Opnd *opndIndir = IR::IndirOpnd::New(propertySymOpnd->CreatePropertyOwnerOpnd(func), Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, func);
    IR::RegOpnd *regOpnd = IR::RegOpnd::New(auxSlotPtrSym, TyMachReg, func);
    regOpnd->SetIsJITOptimizedReg(true);
    InsertMove(regOpnd, opndIndir, instrInsert);
}